

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandVarMin(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_3c;
  int c;
  int fVerbose;
  int fCheck;
  int fUseSimple;
  int nVars;
  int nOnes;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fUseSimple = 4;
  fCheck = 0x14;
  fVerbose = 0;
  c = 0;
  local_3c = 0;
  Extra_UtilGetoptReset();
LAB_0026feed:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"MNocvh");
    if (iVar1 == -1) {
      if (argc == globalUtilOptind + 1) {
        Abc_SuppReadMinTest(argv[globalUtilOptind]);
        return 0;
      }
      Abc_SuppTest(fUseSimple,fCheck,fVerbose,c,local_3c);
      return 0;
    }
    switch(iVar1) {
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_0027007d;
      }
      fUseSimple = atoi(argv[globalUtilOptind]);
      iVar1 = fUseSimple;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_0027007d;
      }
      fCheck = atoi(argv[globalUtilOptind]);
      iVar1 = fCheck;
      break;
    default:
      goto LAB_0027007d;
    case 99:
      c = c ^ 1;
      goto LAB_0026feed;
    case 0x68:
      goto LAB_0027007d;
    case 0x6f:
      fVerbose = fVerbose ^ 1;
      goto LAB_0026feed;
    case 0x76:
      local_3c = local_3c ^ 1;
      goto LAB_0026feed;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0027007d:
      Abc_Print(-2,"usage: varmin [-MN <num>] [-ocvh]\n");
      Abc_Print(-2,"\t           performs support minimization\n");
      Abc_Print(-2,"\t-M <num> : the number of ones in the combination [default = %d]\n",
                (ulong)(uint)fUseSimple);
      Abc_Print(-2,"\t-N <num> : the number of variables in the problem [default = %d]\n",
                (ulong)(uint)fCheck);
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-o       : toggle computing reduced difference matrix [default = %s]\n",pcVar2
               );
      pcVar2 = "no";
      if (c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-c       : toggle verifying the final result [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_3c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandVarMin( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_SuppTest( int nOnes, int nVars, int fUseSimple, int fCheck, int fVerbose );
    extern void Abc_SuppReadMinTest( char * pFileName );
    int nOnes      =  4;
    int nVars      = 20;
    int fUseSimple =  0;
    int fCheck     =  0;
    int fVerbose   =  0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MNocvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nOnes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOnes < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 0 )
                goto usage;
            break;
        case 'o':
            fUseSimple ^= 1;
            break;
        case 'c':
            fCheck ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        Abc_SuppReadMinTest( argv[globalUtilOptind] );
        return 0;
    }
    Abc_SuppTest( nOnes, nVars, fUseSimple, fCheck, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: varmin [-MN <num>] [-ocvh]\n" );
    Abc_Print( -2, "\t           performs support minimization\n" );
    Abc_Print( -2, "\t-M <num> : the number of ones in the combination [default = %d]\n", nOnes );
    Abc_Print( -2, "\t-N <num> : the number of variables in the problem [default = %d]\n", nVars );
    Abc_Print( -2, "\t-o       : toggle computing reduced difference matrix [default = %s]\n", fUseSimple? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggle verifying the final result [default = %s]\n", fCheck? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}